

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabItem *tab;
  ImVec4 *pIVar2;
  ImVec4 *pIVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  ImGuiColorMod *pIVar7;
  ImGuiTabItem *pIVar8;
  ImGuiWindow *pIVar9;
  float fVar10;
  float fVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  char *pcVar18;
  ImDrawList *this;
  char *pcVar19;
  undefined8 uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  char buf [256];
  ImVec2 local_148;
  ImVec2 local_140;
  char local_138 [256];
  undefined1 local_38 [8];
  
  iVar5 = tab_bar->PrevFrameVisible;
  iVar15 = GImGui->FrameCount + -2;
  pcVar18 = " *Inactive*";
  if (iVar15 <= iVar5) {
    pcVar18 = "";
  }
  iVar16 = ImFormatString(local_138,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                          (ulong)(uint)(tab_bar->Tabs).Size,pcVar18);
  iVar17 = ImFormatString(local_138 + iVar16,0x100 - (long)iVar16,"  { ");
  pcVar18 = local_138 + iVar16 + iVar17;
  if ((tab_bar->Tabs).Size < 1) {
    pcVar19 = " } ";
  }
  else {
    lVar23 = 0;
    lVar21 = 0;
    do {
      pcVar19 = ", ";
      if (lVar23 == 0) {
        pcVar19 = "";
      }
      iVar16 = ImFormatString(pcVar18,(size_t)(local_38 + -(long)pcVar18),"%s\'%s\'",pcVar19);
      pcVar18 = pcVar18 + iVar16;
      lVar21 = lVar21 + 1;
      iVar16 = (tab_bar->Tabs).Size;
      iVar17 = 3;
      if (iVar16 < 3) {
        iVar17 = iVar16;
      }
      lVar23 = lVar23 + 0x28;
    } while (lVar21 < iVar17);
    pcVar19 = " } ";
    if (3 < iVar16) {
      pcVar19 = " ... }";
    }
  }
  ImFormatString(pcVar18,(size_t)(local_38 + -(long)pcVar18),pcVar19);
  if (iVar5 < iVar15) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
    bVar13 = TreeNode(label,"%s",local_138);
    pIVar12 = GImGui;
    lVar21 = (long)(GImGui->ColorStack).Size;
    pIVar7 = (GImGui->ColorStack).Data;
    pIVar2 = &pIVar7[lVar21 + -1].BackupValue;
    fVar4 = pIVar2->y;
    fVar10 = pIVar2->z;
    fVar11 = pIVar2->w;
    pIVar3 = (GImGui->Style).Colors + pIVar7[lVar21 + -1].Col;
    pIVar3->x = pIVar2->x;
    pIVar3->y = fVar4;
    pIVar3->z = fVar10;
    pIVar3->w = fVar11;
    (pIVar12->ColorStack).Size = (pIVar12->ColorStack).Size + -1;
  }
  else {
    bVar13 = TreeNode(label,"%s",local_138);
    bVar14 = IsItemHovered(0);
    if (bVar14) {
      this = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar13) {
    if (0 < (tab_bar->Tabs).Size) {
      lVar21 = 0;
      uVar22 = 0;
      do {
        pIVar8 = (tab_bar->Tabs).Data;
        tab = (ImGuiTabItem *)((long)&pIVar8->ID + lVar21);
        PushID(tab);
        bVar14 = SmallButton("<");
        if (bVar14) {
          TabBarQueueReorder(tab_bar,tab,-1);
        }
        pIVar9 = GImGui->CurrentWindow;
        pIVar9->WriteAccessed = true;
        if (pIVar9->SkipItems == false) {
          fVar4 = (pIVar9->DC).CursorPosPrevLine.y;
          (pIVar9->DC).CursorPos.x = (pIVar9->DC).CursorPosPrevLine.x + 2.0;
          (pIVar9->DC).CursorPos.y = fVar4;
          (pIVar9->DC).CurrLineSize = (pIVar9->DC).PrevLineSize;
          (pIVar9->DC).CurrLineTextBaseOffset = (pIVar9->DC).PrevLineTextBaseOffset;
        }
        bVar14 = SmallButton(">");
        if (bVar14) {
          TabBarQueueReorder(tab_bar,tab,1);
        }
        pIVar12 = GImGui;
        pIVar9 = GImGui->CurrentWindow;
        pIVar9->WriteAccessed = true;
        if (pIVar9->SkipItems == false) {
          (pIVar9->DC).CursorPos.x =
               (pIVar12->Style).ItemSpacing.x + (pIVar9->DC).CursorPosPrevLine.x;
          (pIVar9->DC).CursorPos.y = (pIVar9->DC).CursorPosPrevLine.y;
          (pIVar9->DC).CurrLineSize = (pIVar9->DC).PrevLineSize;
          (pIVar9->DC).CurrLineTextBaseOffset = (pIVar9->DC).PrevLineTextBaseOffset;
        }
        uVar6 = *(uint *)((long)&pIVar8->ID + lVar21);
        uVar20 = 0x20;
        if (uVar6 == tab_bar->SelectedTabId) {
          uVar20 = 0x2a;
        }
        lVar23 = (long)*(int *)((long)&pIVar8->NameOffset + lVar21);
        pcVar18 = "???";
        if (lVar23 != -1) {
          pcVar18 = (tab_bar->TabsNames).Buf.Data + lVar23;
        }
        Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
             SUB84((double)*(float *)((long)&pIVar8->Offset + lVar21),0),
             (double)*(float *)((long)&pIVar8->Width + lVar21),
             (double)*(float *)((long)&pIVar8->ContentWidth + lVar21),uVar22 & 0xffffffff,uVar20,
             (ulong)uVar6,pcVar18);
        pIVar1 = &GImGui->CurrentWindow->IDStack;
        pIVar1->Size = pIVar1->Size + -1;
        uVar22 = uVar22 + 1;
        lVar21 = lVar21 + 0x28;
      } while ((long)uVar22 < (long)(tab_bar->Tabs).Size);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    p += ImFormatString(p, buf_end - p, "  { ");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'",
            tab_n > 0 ? ", " : "", (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}